

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  _Base_ptr *pp_Var1;
  pointer *pppVVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 uVar4;
  size_type sVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ushort uVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  unsigned_long langs;
  StructDef *pSVar13;
  long lVar15;
  const_iterator cVar16;
  HashFunction p_Var17;
  HashFunction p_Var18;
  HashFunction p_Var19;
  const_iterator cVar20;
  long *plVar21;
  EnumVal *pEVar22;
  Value *pVVar23;
  size_type *psVar24;
  long *plVar25;
  string *in_RDX;
  int t;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  EnumDef **ppEVar28;
  _Base_ptr *pp_Var29;
  undefined8 *puVar30;
  int *piVar31;
  char cVar32;
  bool bVar33;
  bool bVar34;
  byte bVar35;
  string type_name;
  FieldDef *field;
  FieldDef *typefield;
  string name;
  voffset_t id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  Value *local_190;
  _Alloc_hider local_188;
  StructDef *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  long local_148;
  _Base_ptr local_140;
  Value *local_138;
  _Base_ptr local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Alloc_hider local_e8;
  StructDef *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  _Base_ptr p_Var14;
  
  sVar5 = (struct_def->super_Definition).file._M_string_length;
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,sVar5,
             (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar5);
  pSVar13 = LookupCreateStruct((Parser *)struct_def,(string *)&local_e8,false,false);
  if (pSVar13 != (StructDef *)0x0) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"field name can not be the same as table/struct name","");
    Error(this,(string *)struct_def);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                               CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                        local_168.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    goto LAB_0010b952;
  }
  bVar33 = local_e0 == (StructDef *)0x0;
  if (!bVar33) {
    bVar33 = false;
    pSVar13 = (StructDef *)0x1;
    do {
      cVar32 = (local_e8._M_p + -1)[(long)pSVar13];
      if ((0x19 < (int)cVar32 - 0x61U) && (cVar32 != '_' && 9 < (int)cVar32 - 0x30U)) break;
      bVar33 = local_e0 <= pSVar13;
      bVar34 = pSVar13 != local_e0;
      pSVar13 = (StructDef *)((long)&(pSVar13->super_Definition).name._M_dataplus._M_p + 1);
    } while (bVar34);
  }
  if (!bVar33) {
    std::operator+(&local_168,"field names should be lowercase snake_case, got: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
    Warning((Parser *)struct_def,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                               CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                        local_168.field_2._M_allocated_capacity._0_2_)) + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(struct_def->super_Definition).doc_comment.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  t = (int)struct_def;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      local_168.field_2._M_allocated_capacity._0_2_ = 0;
      local_168.field_2._M_allocated_capacity._2_4_ = 0;
      local_168.field_2._M_allocated_capacity._6_2_ = 0;
      local_168.field_2._8_2_ = 0;
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length._0_2_ = 0;
      local_168._M_string_length._2_6_ = 0;
      ParseType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        if (in_RDX[8].field_2._M_local_buf[0] == '\x01') {
          if ((((uint)local_168._M_dataplus._M_p != 0xf) ||
              (*(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                  (undefined2)local_168._M_string_length) + 0x111) == '\0')) &&
             (((uint)local_168._M_dataplus._M_p != 0x11 ||
              ((local_168._M_dataplus._M_p._4_4_ != 0xf ||
               (*(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                   (undefined2)local_168._M_string_length) + 0x111) != '\x01'))))))
          {
            cVar32 = (uint)local_168._M_dataplus._M_p - 1 < 0xc;
            if ((uint)local_168._M_dataplus._M_p == 0xf) {
              cVar32 = *(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                          (undefined2)local_168._M_string_length) + 0x110);
            }
            if ((((uint)local_168._M_dataplus._M_p == 0x11) && (cVar32 == '\0')) &&
               (cVar32 = '\x01', 0xb < local_168._M_dataplus._M_p._4_4_ - 1)) {
              if (local_168._M_dataplus._M_p._4_4_ == 0xf) {
                cVar32 = *(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                            (undefined2)local_168._M_string_length) + 0x110);
              }
              else {
                cVar32 = '\0';
              }
            }
            if (cVar32 == '\0') {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"structs may contain only scalar or struct fields","")
              ;
              Error(this,(string *)struct_def);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0010b945;
            }
            goto LAB_0010b7a2;
          }
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          lVar15 = *(long *)CONCAT62(local_168._M_string_length._2_6_,
                                     (undefined2)local_168._M_string_length);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,lVar15,
                     ((long *)CONCAT62(local_168._M_string_length._2_6_,
                                       (undefined2)local_168._M_string_length))[1] + lVar15);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"Incomplete type in struct is not allowed, type name: ",""
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_188,&local_1b0,&local_1d8);
          Error(this,(string *)struct_def);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_p != &local_178) {
            operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
LAB_0010b92f:
          local_68.field_2._M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
          local_68._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_0010b945;
        }
        else {
LAB_0010b7a2:
          if ((in_RDX[8].field_2._M_local_buf[0] == '\0') &&
             ((uint)local_168._M_dataplus._M_p == 0x11)) {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"fixed-length array in table must be wrapped in struct",
                       "");
            Error(this,(string *)struct_def);
            goto LAB_0010b92f;
          }
          if (((uint)local_168._M_dataplus._M_p == 0x11) &&
             (pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                          super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
             *(byte *)pppVVar2 = *(byte *)pppVVar2 | 1,
             ((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
             (undefined1  [16])0xffffffffffffb854) != (undefined1  [16])0x0)) {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,
                       "Arrays are not yet supported in all the specified programming languages.",""
                      );
            Error(this,(string *)struct_def);
            goto LAB_0010b92f;
          }
          local_130 = (_Base_ptr)0x0;
          if ((uint)local_168._M_dataplus._M_p == 0x10) {
            lVar15 = CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                              CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                       local_168.field_2._M_allocated_capacity._0_2_));
            local_1d8._M_string_length = *(size_type *)(lVar15 + 0xd8);
            local_1d8.field_2._M_allocated_capacity = *(size_type *)(lVar15 + 0xe0);
            local_1d8.field_2._8_8_ = *(ulong *)(lVar15 + 0xe8);
            local_1d8._M_dataplus._M_p._4_4_ =
                 (undefined4)((ulong)*(undefined8 *)(lVar15 + 0xd0) >> 0x20);
            local_1d8._M_dataplus._M_p._0_4_ = 1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8,"_type");
            AddField(this,struct_def,in_RDX,(Type *)&local_188,(FieldDef **)&local_1d8);
LAB_0010b8a7:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_p != &local_178) {
              operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
            }
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b945;
          }
          else if ((((uint)local_168._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) &&
                  (local_168._M_dataplus._M_p._4_4_ == 0x10)) {
            pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(byte *)pppVVar2 = *(byte *)pppVVar2 | 2;
            if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                (undefined1  [16])0xfffffffffff47c34) != (undefined1  [16])0x0) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "Vectors of unions are not yet supported in at least one of the specified programming languages."
                         ,"");
              Error(this,(string *)struct_def);
              goto LAB_0010b92f;
            }
            local_1d8.field_2._M_allocated_capacity =
                 CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                          CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                   local_168.field_2._M_allocated_capacity._0_2_));
            local_1d8._M_dataplus._M_p = (pointer)0x10000000e;
            local_1d8._M_string_length = 0;
            local_1d8.field_2._8_8_ = local_1d8.field_2._8_8_ & 0xffffffffffff0000;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8,"_type");
            AddField(this,struct_def,in_RDX,(Type *)&local_188,(FieldDef **)&local_1d8);
            goto LAB_0010b8a7;
          }
          AddField(this,struct_def,in_RDX,(Type *)&local_e8,(FieldDef **)&local_168);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b945;
          if (local_130 != (_Base_ptr)0x0) {
            local_130[9]._M_left = (_Base_ptr)local_138;
            (((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               *)&local_138[4].type)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_130;
          }
          if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x3d)
          goto LAB_0010bbde;
          Next(this);
          pVVar23 = local_138;
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b945;
          ParseSingleValue(this,(string *)struct_def,local_138,(bool)((char)local_138 + -0x38));
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b945;
          if ((((uint)local_168._M_dataplus._M_p == 0xf) &&
              (*(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                  (undefined2)local_168._M_string_length) + 0x110) != '\0')) ||
             ((in_RDX[8].field_2._M_local_buf[0] == '\x01' &&
              (iVar11 = std::__cxx11::string::compare((char *)&pVVar23[3].type.enum_def),
              iVar11 != 0)))) {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,
                       "default values are not supported for struct fields, table fields, or in structs."
                       ,"");
            Error(this,(string *)struct_def);
            goto LAB_0010b92f;
          }
          if (((uint)local_168._M_dataplus._M_p < 0x13) &&
             ((0x46000U >> ((uint)local_168._M_dataplus._M_p & 0x1f) & 1) != 0)) {
            pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(byte *)pppVVar2 = *(byte *)pppVVar2 | 8;
            iVar11 = std::__cxx11::string::compare((char *)&pVVar23[3].type.enum_def);
            if ((iVar11 != 0) &&
               (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                (undefined1  [16])0xfffffffffffcbfff) != (undefined1  [16])0x0)) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "Default values for strings and vectors are not supported in one of the specified programming languages"
                         ,"");
              Error(this,(string *)struct_def);
              goto LAB_0010b92f;
            }
          }
          if (((uint)local_168._M_dataplus._M_p == 0x12) ||
             ((uint)local_168._M_dataplus._M_p == 0xe)) {
            ppEVar28 = &pVVar23[3].type.enum_def;
            iVar11 = std::__cxx11::string::compare((char *)ppEVar28);
            if ((iVar11 != 0) &&
               (iVar11 = std::__cxx11::string::compare((char *)ppEVar28), iVar11 != 0)) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"The only supported default for vectors is `[]`.","");
              Error(this,(string *)struct_def);
              goto LAB_0010b92f;
            }
          }
LAB_0010bbde:
          if ((uint)local_168._M_dataplus._M_p - 0xb < 2) {
            if ((((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   *)&local_138[3].type)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left ==
                (_Base_ptr)0x0) {
              __assert_fail("false == text.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                            ,0x3f1,"CheckedError flatbuffers::Parser::ParseField(StructDef &)");
            }
            pp_Var29 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)&local_138[3].type)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
            for (p_Var14 = *pp_Var29; uVar4 = (undefined1)p_Var14->_M_color, uVar4 == 0x20;
                p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 1)) {
            }
            if ((uVar4 == 0x2b) || (uVar4 == 0x2d)) {
              p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 1);
            }
            uVar12 = (uint)(char)p_Var14->_M_color;
            if (((uVar12 != 0x5f) && (0x19 < (uVar12 & 0xffffffdf) - 0x41)) &&
               (lVar15 = std::__cxx11::string::find_first_of((char *)pp_Var29,0x1b5c0c,0),
               lVar15 == -1)) {
              std::__cxx11::string::append((char *)pp_Var29);
            }
          }
          pVVar23 = local_138;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_138->offset,&local_48);
          local_190 = (Value *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                _M_header._M_parent;
          ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)struct_def);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010b945;
          paVar3 = &local_1d8.field_2;
          local_1d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"deprecated","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          local_140 = (_Base_ptr)
                      &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
          ;
          if (cVar16._M_node == local_140) {
            bVar33 = false;
          }
          else {
            bVar33 = *(long *)(cVar16._M_node + 2) != 0;
          }
          pVVar23[3].constant.field_2._M_local_buf[8] = bVar33;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          local_1d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"hash","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          if (cVar16._M_node == local_140) {
            local_148 = 0;
          }
          else {
            local_148 = *(long *)(cVar16._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if (local_148 != 0) {
            uVar12 = (uint)local_168._M_dataplus._M_p;
            if (((uint)local_168._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) {
              uVar12 = local_168._M_dataplus._M_p._4_4_;
            }
            if (uVar12 < 0xb) {
              if ((0x60U >> (uVar12 & 0x1f) & 1) == 0) {
                if ((0x180U >> (uVar12 & 0x1f) & 1) == 0) {
                  if ((0x600U >> (uVar12 & 0x1f) & 1) == 0) goto LAB_0010c2ee;
                  p_Var17 = FindHashFunction64(*(char **)(local_148 + 0x20));
                  if (p_Var17 != (HashFunction)0x0) goto LAB_0010be5f;
                  std::operator+(&local_1d8,"Unknown hashing algorithm for 64 bit types: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_148 + 0x20));
                  Error(this,(string *)struct_def);
                }
                else {
                  p_Var18 = FindHashFunction32(*(char **)(local_148 + 0x20));
                  if (p_Var18 != (HashFunction)0x0) goto LAB_0010be5f;
                  std::operator+(&local_1d8,"Unknown hashing algorithm for 32 bit types: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_148 + 0x20));
                  Error(this,(string *)struct_def);
                }
              }
              else {
                p_Var19 = FindHashFunction16(*(char **)(local_148 + 0x20));
                if (p_Var19 != (HashFunction)0x0) goto LAB_0010be5f;
                std::operator+(&local_1d8,"Unknown hashing algorithm for 16 bit types: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_148 + 0x20));
                Error(this,(string *)struct_def);
              }
            }
            else {
LAB_0010c2ee:
              local_1d8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "only short, ushort, int, uint, long and ulong data types support hashing."
                         ,"");
              Error(this,(string *)struct_def);
            }
            goto LAB_0010c392;
          }
LAB_0010be5f:
          local_1d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"vector64","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          if (cVar16._M_node == local_140) {
            bVar33 = true;
          }
          else {
            bVar33 = *(long *)(cVar16._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if (!bVar33) {
            if (((uint)local_168._M_dataplus._M_p != 0xe) &&
               ((uint)local_168._M_dataplus._M_p != 0x12)) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"`vector64` attribute can only be applied on vectors."
                         ,"");
              Error(this,(string *)struct_def);
              goto LAB_0010c392;
            }
            local_168.field_2._8_2_ = 0;
            local_168._M_dataplus._M_p._0_4_ = 0x12;
            *(ulong *)&pVVar23[2].field_0x42 =
                 CONCAT26(local_168.field_2._M_allocated_capacity._0_2_,
                          local_168._M_string_length._2_6_);
            *(undefined4 *)
             &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 *)&pVVar23[3].type)->_M_t)._M_impl.field_0x2 =
                 local_168.field_2._M_allocated_capacity._2_4_;
            *(undefined2 *)
             &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 *)&pVVar23[3].type)->_M_t)._M_impl.field_0x6 =
                 local_168.field_2._M_allocated_capacity._6_2_;
            *(undefined2 *)
             &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 *)&pVVar23[3].type)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            *(undefined4 *)((long)&pVVar23[2].constant.field_2 + 8) = 0x12;
            *(uint *)((long)&pVVar23[2].constant.field_2 + 0xc) = local_168._M_dataplus._M_p._4_4_;
            *(pointer *)&pVVar23[2].offset =
                 (pointer)CONCAT62(local_168._M_string_length._2_6_,
                                   (undefined2)local_168._M_string_length);
            pVVar23[3].constant.field_2._M_local_buf[0xd] = '\x01';
          }
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"offset64","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          if (cVar16._M_node == local_140) {
            bVar33 = true;
          }
          else {
            bVar33 = *(long *)(cVar16._M_node + 2) == 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          paVar3 = &local_1d8.field_2;
          if (!bVar33) {
            if ((uint)local_168._M_dataplus._M_p == 0x12) {
              local_1d8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "attribute `vector64` implies `offset64` and isn\'t required.","");
              Warning((Parser *)struct_def,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar3) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
            }
            pVVar23[3].constant.field_2._M_local_buf[0xd] = '\x01';
          }
          if (pVVar23[3].constant.field_2._M_local_buf[0xd] == '\x01') {
            if ((uint)local_168._M_dataplus._M_p == 0xd) {
LAB_0010c069:
              if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                  (undefined1  [16])0xfffffffffffffe77) == (undefined1  [16])0x0) goto LAB_0010c0a2;
              local_1d8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "fields using 64-bit offsets are not yet supported in at least one of the specified programming languages."
                         ,"");
              Error(this,(string *)struct_def);
            }
            else if (((uint)local_168._M_dataplus._M_p == 0xe) ||
                    ((uint)local_168._M_dataplus._M_p == 0x12)) {
              if (((local_168._M_dataplus._M_p._4_4_ - 1 < 0xc) &&
                  ((9 < local_168._M_dataplus._M_p._4_4_ - 1 ||
                   (CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                             CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                      local_168.field_2._M_allocated_capacity._0_2_)) == 0)))) ||
                 ((local_168._M_dataplus._M_p._4_4_ == 0xf &&
                  (*(char *)(CONCAT62(local_168._M_string_length._2_6_,
                                      (undefined2)local_168._M_string_length) + 0x110) != '\0'))))
              goto LAB_0010c069;
              local_1d8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"only vectors of scalars are allowed to be 64-bit.",""
                        );
              Error(this,(string *)struct_def);
            }
            else {
              local_1d8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "only string and vectors can have `offset64` attribute applied","");
              Error(this,(string *)struct_def);
            }
            goto LAB_0010c392;
          }
LAB_0010c0a2:
          local_1d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"key","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          if (cVar16._M_node == local_140) {
            bVar33 = false;
          }
          else {
            bVar33 = *(long *)(cVar16._M_node + 2) != 0;
          }
          pVVar23[3].constant.field_2._M_local_buf[9] = bVar33;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          local_1d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"required","");
          cVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_190,&local_1d8);
          if ((cVar16._M_node == local_140) || (bVar10 = 1, *(long *)(cVar16._M_node + 2) == 0)) {
            if ((uint)local_168._M_dataplus._M_p == 0xd) {
              bVar10 = pVVar23[3].constant.field_2._M_local_buf[9];
            }
            else {
              bVar10 = 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          bVar33 = false;
          if (((uint)local_168._M_dataplus._M_p < 0x13) &&
             (bVar33 = false, (0x46000U >> ((uint)local_168._M_dataplus._M_p & 0x1f) & 1) != 0)) {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                            *)&local_138[3].type)->_M_t)._M_impl.
                                         super__Rb_tree_header._M_header._M_parent);
            bVar33 = iVar11 != 0;
          }
          if ((uint)local_168._M_dataplus._M_p - 1 < 0xc) {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                            *)&local_138[3].type)->_M_t)._M_impl.
                                         super__Rb_tree_header._M_header._M_parent);
            bVar35 = iVar11 == 0;
          }
          else {
            bVar35 = (bVar33 | bVar10) ^ 1;
          }
          bVar33 = (bVar10 & bVar35) == 1;
          if (bVar33) {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"Fields cannot be both optional and required.","");
            Error(this,(string *)struct_def);
            goto LAB_0010b92f;
          }
          if (bVar33) {
            __assert_fail("!(required && optional)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                          ,0x178,
                          "static Presence flatbuffers::FieldDef::MakeFieldPresence(bool, bool)");
          }
          iVar11 = 0;
          if (bVar10 == 0) {
            iVar11 = 2 - (uint)bVar35;
          }
          *(int *)&local_138[3].offset = iVar11;
          if ((bVar10 == 0) ||
             ((in_RDX[8].field_2._M_local_buf[0] == '\0' &&
              (0xb < (uint)local_168._M_dataplus._M_p - 1)))) {
            if (local_138[3].constant.field_2._M_local_buf[9] == '\x01') {
              if (in_RDX[8].field_2._M_local_buf[3] == '\x01') {
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,"only one field may be set as \'key\'","");
                Error(this,(string *)struct_def);
              }
              else {
                in_RDX[8].field_2._M_local_buf[3] = '\x01';
                bVar10 = 1;
                if (0xc < (uint)local_168._M_dataplus._M_p - 1) {
                  if ((uint)local_168._M_dataplus._M_p == 0xf) {
                    bVar10 = *(byte *)(CONCAT62(local_168._M_string_length._2_6_,
                                                (undefined2)local_168._M_string_length) + 0x110);
                  }
                  else {
                    bVar10 = 0;
                  }
                }
                if ((uint)local_168._M_dataplus._M_p == 0x11) {
                  bVar35 = 1;
                  if (0xb < local_168._M_dataplus._M_p._4_4_ - 1) {
                    if (local_168._M_dataplus._M_p._4_4_ == 0xf) {
                      bVar35 = *(byte *)(CONCAT62(local_168._M_string_length._2_6_,
                                                  (undefined2)local_168._M_string_length) + 0x110);
                    }
                    else {
                      bVar35 = 0;
                    }
                  }
                  bVar10 = bVar10 | bVar35;
                }
                if (bVar10 != 0) goto LAB_0010c404;
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,
                           "\'key\' field must be string, scalar type or fixed size array of scalars"
                           ,"");
                Error(this,(string *)struct_def);
              }
              goto LAB_0010c392;
            }
LAB_0010c404:
            pVVar23 = local_138;
            if ((*(int *)((long)&local_138[2].constant.field_2 + 8) - 1U < 0xc) &&
               (*(int *)&local_138[3].offset == 1)) {
              local_190 = local_138;
              pppVVar2 = &struct_def[5].super_Definition.attributes.vec.
                          super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(byte *)pppVVar2 = *(byte *)pppVVar2 | 4;
              lVar15 = CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                                CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                         local_168.field_2._M_allocated_capacity._0_2_));
              if (lVar15 == 0) {
LAB_0010c482:
                bVar33 = false;
              }
              else {
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"null","");
                cVar20 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                                 *)(lVar15 + 0xf0),&local_1d8);
                if (cVar20._M_node == (_Base_ptr)(lVar15 + 0xf8)) goto LAB_0010c482;
                bVar33 = *(long *)(cVar20._M_node + 2) != 0;
              }
              if ((lVar15 != 0) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if (bVar33) {
                if (9 < (uint)local_168._M_dataplus._M_p - 1) {
                  __assert_fail("IsInteger(type.base_type)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                                ,0x480,"CheckedError flatbuffers::Parser::ParseField(StructDef &)");
                }
                std::operator+(&local_1b0,
                               "the default \'null\' is reserved for declaring optional scalar fields, it conflicts with declaration of enum \'"
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                                          CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                                   local_168.field_2._M_allocated_capacity._0_2_)));
                plVar21 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                psVar24 = (size_type *)(plVar21 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar21 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar24) {
                  local_178._M_allocated_capacity = *psVar24;
                  local_178._8_8_ = plVar21[3];
                  local_188._M_p = (pointer)&local_178;
                }
                else {
                  local_178._M_allocated_capacity = *psVar24;
                  local_188._M_p = (pointer)*plVar21;
                }
                local_180 = (StructDef *)plVar21[1];
                *plVar21 = (long)psVar24;
                plVar21[1] = 0;
                *(undefined1 *)(plVar21 + 2) = 0;
                Error(this,(string *)struct_def);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_p != &local_178) {
                  operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
                }
                goto LAB_0010cfe9;
              }
              local_188._M_p = (pointer)&local_178;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"key","");
              cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                     *)&local_190[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(key_type *)&local_188);
              if (cVar16._M_node ==
                  (_Base_ptr)
                  &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)&local_190[1].type)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left)
              {
                bVar33 = true;
              }
              else {
                bVar33 = *(long *)(cVar16._M_node + 2) == 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_p != &local_178) {
                operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
              }
              if (bVar33) {
                uVar6 = *(ulong *)((long)&struct_def[5].super_Definition.name.field_2 + 8);
                pVVar23 = local_190;
                if ((uVar6 == 0) || (uVar6 < 0x80001 && (uVar6 & 0xfffffffffff41c50) == 0))
                goto LAB_0010c5de;
                local_188._M_p = (pointer)&local_178;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_188,
                           "Optional scalars are not yet supported in at least one of the specified programming languages."
                           ,"");
                Error(this,(string *)struct_def);
              }
              else {
                local_188._M_p = (pointer)&local_178;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_188,
                           "only a non-optional scalar field can be used as a \'key\' field","");
                Error(this,(string *)struct_def);
              }
              local_68.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
              local_68._M_dataplus._M_p = local_188._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_p == &local_178) goto LAB_0010b945;
            }
            else {
LAB_0010c5de:
              lVar15 = CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                                CONCAT42(local_168.field_2._M_allocated_capacity._2_4_,
                                         local_168.field_2._M_allocated_capacity._0_2_));
              if (lVar15 != 0) {
                local_190 = (Value *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                         *)&pVVar23[3].type)->_M_t)._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent;
                switch((uint)local_168._M_dataplus._M_p) {
                case 0xe:
                case 0x12:
                  iVar11 = std::__cxx11::string::compare((char *)local_190);
                  if ((iVar11 != 0) &&
                     (iVar11 = std::__cxx11::string::compare((char *)local_190), iVar11 != 0)) {
                    local_188._M_p = (pointer)&local_178;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"Vector defaults may only be `[]`.","");
                    Error(this,(string *)struct_def);
LAB_0010c838:
                    local_68.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
                    local_68._M_dataplus._M_p = local_188._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_p == &local_178) goto LAB_0010b945;
                    goto LAB_0010b93d;
                  }
                  break;
                default:
                  if (9 < (uint)local_168._M_dataplus._M_p - 1) {
                    local_188._M_p = (pointer)&local_178;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"Enums must have integer base types","");
                    Error(this,(string *)struct_def);
                    goto LAB_0010c838;
                  }
                  local_140 = (_Base_ptr)CONCAT44(local_140._4_4_,*(int *)&pVVar23[3].offset);
                  if (*(int *)&pVVar23[3].offset == 1) {
                    bVar33 = false;
                  }
                  else {
                    local_188._M_p = (pointer)&local_178;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"bit_flags","");
                    cVar16 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                     *)(lVar15 + 0x58),(key_type *)&local_188);
                    if (cVar16._M_node == (_Base_ptr)(lVar15 + 0x60)) {
                      bVar33 = true;
                    }
                    else {
                      bVar33 = *(long *)(cVar16._M_node + 2) == 0;
                    }
                  }
                  if (((int)local_140 != 1) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_p != &local_178)) {
                    operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
                  }
                  if ((bVar33) &&
                     (pEVar22 = EnumDef::FindByValue
                                          ((EnumDef *)
                                           CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                                                    CONCAT42(local_168.field_2._M_allocated_capacity
                                                             ._2_4_,local_168.field_2.
                                                                    _M_allocated_capacity._0_2_)),
                                           (string *)local_190), pEVar22 == (EnumVal *)0x0)) {
                    std::operator+(&local_68,"default value of `",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_190);
                    plVar21 = (long *)std::__cxx11::string::append((char *)&local_68);
                    local_c8 = &local_b8;
                    plVar25 = plVar21 + 2;
                    if ((long *)*plVar21 == plVar25) {
                      local_b8 = *plVar25;
                      lStack_b0 = plVar21[3];
                    }
                    else {
                      local_b8 = *plVar25;
                      local_c8 = (long *)*plVar21;
                    }
                    local_c0 = plVar21[1];
                    *plVar21 = (long)plVar25;
                    plVar21[1] = 0;
                    *(undefined1 *)(plVar21 + 2) = 0;
                    plVar21 = (long *)std::__cxx11::string::append((char *)&local_c8);
                    psVar24 = (size_type *)(plVar21 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar21 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar24) {
                      local_a8.field_2._M_allocated_capacity = *psVar24;
                      local_a8.field_2._8_8_ = plVar21[3];
                      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                    }
                    else {
                      local_a8.field_2._M_allocated_capacity = *psVar24;
                      local_a8._M_dataplus._M_p = (pointer)*plVar21;
                    }
                    local_a8._M_string_length = plVar21[1];
                    *plVar21 = (long)psVar24;
                    plVar21[1] = 0;
                    *(undefined1 *)(plVar21 + 2) = 0;
                    std::operator+(&local_88,&local_a8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_e8);
                    plVar21 = (long *)std::__cxx11::string::append((char *)&local_88);
                    psVar24 = (size_type *)(plVar21 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar21 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar24) {
                      local_128.field_2._M_allocated_capacity = *psVar24;
                      local_128.field_2._8_8_ = plVar21[3];
                      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    }
                    else {
                      local_128.field_2._M_allocated_capacity = *psVar24;
                      local_128._M_dataplus._M_p = (pointer)*plVar21;
                    }
                    local_128._M_string_length = plVar21[1];
                    *plVar21 = (long)psVar24;
                    plVar21[1] = 0;
                    *(undefined1 *)(plVar21 + 2) = 0;
                    std::operator+(&local_108,&local_128,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT26(local_168.field_2._M_allocated_capacity._6_2_,
                                               CONCAT42(local_168.field_2._M_allocated_capacity.
                                                        _2_4_,local_168.field_2.
                                                              _M_allocated_capacity._0_2_)));
                    plVar21 = (long *)std::__cxx11::string::append((char *)&local_108);
                    psVar24 = (size_type *)(plVar21 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar21 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar24) {
                      local_1b0.field_2._M_allocated_capacity = *psVar24;
                      local_1b0.field_2._8_8_ = plVar21[3];
                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                    }
                    else {
                      local_1b0.field_2._M_allocated_capacity = *psVar24;
                      local_1b0._M_dataplus._M_p = (pointer)*plVar21;
                    }
                    local_1b0._M_string_length = plVar21[1];
                    *plVar21 = (long)psVar24;
                    plVar21[1] = 0;
                    *(undefined1 *)(plVar21 + 2) = 0;
                    Error(this,(string *)struct_def);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                      operator_delete(local_1b0._M_dataplus._M_p,
                                      local_1b0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p,
                                      local_108.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_128._M_dataplus._M_p != &local_128.field_2) {
                      operator_delete(local_128._M_dataplus._M_p,
                                      local_128.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT62(local_88._M_dataplus._M_p._2_6_,
                                    (ushort)local_88._M_dataplus._M_p) != &local_88.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT62(local_88._M_dataplus._M_p._2_6_,
                                               (ushort)local_88._M_dataplus._M_p),
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      local_a8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_c8 != &local_b8) {
                      operator_delete(local_c8,local_b8 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_0010b93d;
                    goto LAB_0010b945;
                  }
                  break;
                case 0x10:
                  iVar11 = std::__cxx11::string::compare((char *)local_190);
                  if (iVar11 != 0) {
                    local_188._M_p = (pointer)&local_178;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"Union defaults must be NONE","");
                    Error(this,(string *)struct_def);
                    goto LAB_0010c838;
                  }
                  break;
                case 0x11:
                  iVar11 = std::__cxx11::string::compare((char *)local_190);
                  if (iVar11 != 0) {
                    local_188._M_p = (pointer)&local_178;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_188,"Array defaults are not supported yet.","");
                    Error(this,(string *)struct_def);
                    goto LAB_0010c838;
                  }
                }
              }
              if ((pVVar23[3].constant.field_2._M_local_buf[8] == '\x01') &&
                 (in_RDX[8].field_2._M_local_buf[0] == '\x01')) {
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b0,"can\'t deprecate fields in a struct","");
                Error(this,(string *)struct_def);
                local_68.field_2._M_allocated_capacity = local_1b0.field_2._M_allocated_capacity;
                local_68._M_dataplus._M_p = local_1b0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_0010b945;
              }
              else {
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"cpp_type","");
                local_190 = (Value *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                         *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent;
                cVar16 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                 *)local_190,&local_1b0);
                pp_Var29 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                            _M_left;
                if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                  puVar30 = (undefined8 *)0x0;
                }
                else {
                  puVar30 = *(undefined8 **)(cVar16._M_node + 2);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                if (puVar30 != (undefined8 *)0x0) {
                  if (local_148 == 0) {
                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b0,"cpp_type can only be used with a hashed field",
                               "");
                    Error(this,(string *)struct_def);
                    goto LAB_0010cfe9;
                  }
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1b0,"cpp_ptr_type","");
                  cVar16 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   *)local_190,&local_1b0);
                  if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                    bVar33 = true;
                  }
                  else {
                    bVar33 = *(long *)(cVar16._M_node + 2) == 0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar33) {
                    pVVar23 = (Value *)operator_new(0x48);
                    *(undefined8 *)((long)&(pVVar23->type).struct_def + 2) = 0;
                    *(undefined8 *)((long)&(pVVar23->type).enum_def + 2) = 0;
                    (pVVar23->type).base_type = BASE_TYPE_NONE;
                    (pVVar23->type).element = BASE_TYPE_NONE;
                    (pVVar23->type).struct_def = (StructDef *)0x0;
                    (pVVar23->constant)._M_dataplus._M_p = (pointer)&(pVVar23->constant).field_2;
                    *(undefined2 *)&(pVVar23->constant).field_2 = 0x30;
                    (pVVar23->constant)._M_string_length = 1;
                    pVVar23->offset = 0xffff;
                    uVar26 = *puVar30;
                    pSVar13 = (StructDef *)puVar30[1];
                    uVar7 = *(undefined8 *)((long)puVar30 + 10);
                    uVar8 = *(undefined8 *)((long)puVar30 + 0x12);
                    (pVVar23->type).base_type = (int)uVar26;
                    (pVVar23->type).element = (int)((ulong)uVar26 >> 0x20);
                    (pVVar23->type).struct_def = pSVar13;
                    *(undefined8 *)((long)&(pVVar23->type).struct_def + 2) = uVar7;
                    *(undefined8 *)((long)&(pVVar23->type).enum_def + 2) = uVar8;
                    std::__cxx11::string::operator=((string *)&pVVar23->constant,"naked");
                    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b0,"cpp_ptr_type","");
                    SymbolTable<flatbuffers::Value>::Add
                              ((SymbolTable<flatbuffers::Value> *)local_190,&local_1b0,pVVar23);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                      operator_delete(local_1b0._M_dataplus._M_p,
                                      local_1b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"shared","");
                cVar16 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                 *)local_190,&local_1b0);
                pVVar23 = local_138;
                if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                  bVar33 = false;
                }
                else {
                  bVar33 = *(long *)(cVar16._M_node + 2) != 0;
                }
                local_138[3].constant.field_2._M_local_buf[10] = bVar33;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                if ((pVVar23[3].constant.field_2._M_local_buf[10] == '\x01') &&
                   (*(int *)((long)&pVVar23[2].constant.field_2 + 8) != 0xd)) {
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1b0,"shared can only be defined on strings","");
                  Error(this,(string *)struct_def);
                }
                else {
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1b0,"native_custom_alloc","");
                  local_190 = (Value *)&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                           *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent;
                  cVar16 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   *)local_190,&local_1b0);
                  pp_Var29 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                 *)&pVVar23[1].type)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                              _M_left;
                  if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                    bVar33 = true;
                  }
                  else {
                    bVar33 = *(long *)(cVar16._M_node + 2) == 0;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  if (bVar33) {
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b0,"native_inline","");
                    cVar16 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                     *)local_190,&local_1b0);
                    if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                      bVar33 = false;
                    }
                    else {
                      bVar33 = *(long *)(cVar16._M_node + 2) != 0;
                    }
                    pVVar23[3].constant.field_2._M_local_buf[0xb] = bVar33;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                      operator_delete(local_1b0._M_dataplus._M_p,
                                      local_1b0.field_2._M_allocated_capacity + 1);
                    }
                    if (pVVar23[3].constant.field_2._M_local_buf[0xb] == '\x01') {
                      iVar11 = *(int *)((long)&pVVar23[2].constant.field_2 + 8);
                      if ((iVar11 == 0xe) || (iVar11 == 0x12)) {
                        if (((*(int *)((long)&pVVar23[2].constant.field_2 + 0xc) == 0xf) &&
                            (*(char *)(*(pointer *)&pVVar23[2].offset + 0x22) != '\0')) ||
                           ((((iVar11 == 0x12 || (iVar11 == 0xe)) &&
                             (*(int *)((long)&pVVar23[2].constant.field_2 + 0xc) == 0xf)) &&
                            (*(char *)(*(pointer *)&pVVar23[2].offset + 0x22) != '\x01'))))
                        goto LAB_0010cd6e;
                      }
                      else if ((iVar11 == 0xf) &&
                              (*(char *)(*(pointer *)&pVVar23[2].offset + 0x22) != '\0'))
                      goto LAB_0010cd6e;
                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1b0,
                                 "\'native_inline\' can only be defined on structs, vector of structs or vector of tables"
                                 ,"");
                      Error(this,(string *)struct_def);
                    }
                    else {
LAB_0010cd6e:
                      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1b0,"nested_flatbuffer","");
                      cVar16 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       *)local_190,&local_1b0);
                      if (cVar16._M_node == (_Base_ptr)pp_Var29) {
                        piVar31 = (int *)0x0;
                      }
                      else {
                        piVar31 = *(int **)(cVar16._M_node + 2);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                        operator_delete(local_1b0._M_dataplus._M_p,
                                        local_1b0.field_2._M_allocated_capacity + 1);
                      }
                      if (piVar31 == (int *)0x0) {
LAB_0010ce18:
                        local_190 = local_138;
                        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1b0,"flexbuffer","");
                        pp_Var29 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                       *)&local_190[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent;
                        cVar16 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                         *)pp_Var29,&local_1b0);
                        pp_Var1 = &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                      *)&local_190[1].type)->_M_t)._M_impl.super__Rb_tree_header.
                                   _M_header._M_left;
                        if (cVar16._M_node == (_Base_ptr)pp_Var1) {
                          bVar33 = true;
                        }
                        else {
                          bVar33 = *(long *)(cVar16._M_node + 2) == 0;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                          operator_delete(local_1b0._M_dataplus._M_p,
                                          local_1b0.field_2._M_allocated_capacity + 1);
                        }
                        if (!bVar33) {
                          local_190[3].constant.field_2._M_local_buf[0xc] = '\x01';
                          *(undefined1 *)
                           &struct_def[5].super_Definition.attributes.vec.
                            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish = 1;
                          if (((uint)local_168._M_dataplus._M_p != 0xe) ||
                             (local_168._M_dataplus._M_p._4_4_ != 4)) {
                            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1b0,
                                       "flexbuffer attribute may only apply to a vector of ubyte",""
                                      );
                            Error(this,(string *)struct_def);
                            goto LAB_0010cfe9;
                          }
                        }
                        local_140 = local_130;
                        if (local_130 != (_Base_ptr)0x0) {
                          if (0xb < *(int *)&local_130[6]._M_parent - 1U) {
                            *(undefined4 *)&local_130[8]._M_right =
                                 *(undefined4 *)&local_190[3].offset;
                          }
                          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1b0,"id","");
                          cVar16 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                                           *)pp_Var29,&local_1b0);
                          if (cVar16._M_node == (_Base_ptr)pp_Var1) {
                            puVar30 = (undefined8 *)0x0;
                          }
                          else {
                            puVar30 = *(undefined8 **)(cVar16._M_node + 2);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                            operator_delete(local_1b0._M_dataplus._M_p,
                                            local_1b0.field_2._M_allocated_capacity + 1);
                          }
                          if (puVar30 != (undefined8 *)0x0) {
                            local_88._M_dataplus._M_p._0_2_ = 0;
                            anon_unknown_0::atot<unsigned_short>
                                      ((anon_unknown_0 *)&local_1b0,(char *)puVar30[4],
                                       (Parser *)struct_def,(unsigned_short *)&local_88);
                            uVar9 = (ushort)local_88._M_dataplus._M_p;
                            bVar10 = (ushort)local_88._M_dataplus._M_p == 0 |
                                     (byte)local_1b0._M_dataplus._M_p;
                            local_148 = CONCAT71(local_148._1_7_,bVar10);
                            if (bVar10 == 0) {
                              pVVar23 = (Value *)operator_new(0x48);
                              *(undefined8 *)((long)&(pVVar23->type).struct_def + 2) = 0;
                              *(undefined8 *)((long)&(pVVar23->type).enum_def + 2) = 0;
                              (pVVar23->type).base_type = BASE_TYPE_NONE;
                              (pVVar23->type).element = BASE_TYPE_NONE;
                              (pVVar23->type).struct_def = (StructDef *)0x0;
                              (pVVar23->constant)._M_dataplus._M_p =
                                   (pointer)&(pVVar23->constant).field_2;
                              *(undefined2 *)&(pVVar23->constant).field_2 = 0x30;
                              (pVVar23->constant)._M_string_length = 1;
                              pVVar23->offset = 0xffff;
                              uVar26 = *puVar30;
                              pSVar13 = (StructDef *)puVar30[1];
                              uVar7 = *(undefined8 *)((long)puVar30 + 10);
                              uVar8 = *(undefined8 *)((long)puVar30 + 0x12);
                              (pVVar23->type).base_type = (int)uVar26;
                              (pVVar23->type).element = (int)((ulong)uVar26 >> 0x20);
                              (pVVar23->type).struct_def = pSVar13;
                              *(undefined8 *)((long)&(pVVar23->type).struct_def + 2) = uVar7;
                              *(undefined8 *)((long)&(pVVar23->type).enum_def + 2) = uVar8;
                              NumToString<int>(&local_1b0,uVar9 - 1);
                              std::__cxx11::string::operator=
                                        ((string *)&pVVar23->constant,(string *)&local_1b0);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                operator_delete(local_1b0._M_dataplus._M_p,
                                                local_1b0.field_2._M_allocated_capacity + 1);
                              }
                              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1b0,"id","");
                              SymbolTable<flatbuffers::Value>::Add
                                        ((SymbolTable<flatbuffers::Value> *)&local_140[2]._M_right,
                                         &local_1b0,pVVar23);
                              uVar26 = local_1b0.field_2._M_allocated_capacity;
                              _Var27._M_p = local_1b0._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2)
                              goto LAB_0010d508;
                            }
                            else {
                              std::operator+(&local_128,
                                             "a union type effectively adds two fields with non-negative ids, its id must be that of the second field (the first field is the type field and not explicitly declared in the schema);\nfield: "
                                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_190);
                              plVar21 = (long *)std::__cxx11::string::append((char *)&local_128);
                              psVar24 = (size_type *)(plVar21 + 2);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)*plVar21 ==
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)psVar24) {
                                local_108.field_2._M_allocated_capacity = *psVar24;
                                local_108.field_2._8_8_ = plVar21[3];
                                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                              }
                              else {
                                local_108.field_2._M_allocated_capacity = *psVar24;
                                local_108._M_dataplus._M_p = (pointer)*plVar21;
                              }
                              local_108._M_string_length = plVar21[1];
                              *plVar21 = (long)psVar24;
                              plVar21[1] = 0;
                              *(undefined1 *)(plVar21 + 2) = 0;
                              std::operator+(&local_1b0,&local_108,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(puVar30 + 4));
                              Error(this,(string *)struct_def);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                operator_delete(local_1b0._M_dataplus._M_p,
                                                local_1b0.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                                operator_delete(local_108._M_dataplus._M_p,
                                                local_108.field_2._M_allocated_capacity + 1);
                              }
                              uVar26 = local_128.field_2._M_allocated_capacity;
                              _Var27._M_p = local_128._M_dataplus._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_0010d508:
                                operator_delete(_Var27._M_p,uVar26 + 1);
                              }
                            }
                            if ((char)local_148 != '\0') goto LAB_0010b945;
                          }
                          if (local_138[3].constant.field_2._M_local_buf[8] == '\x01') {
                            *(undefined1 *)&local_130[8]._M_left = 1;
                          }
                        }
                        Expect(this,t);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                        }
                        goto LAB_0010b945;
                      }
                      if (*piVar31 == 0xd) {
                        if ((((uint)local_168._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) &&
                           (local_168._M_dataplus._M_p._4_4_ == 4)) {
                          pSVar13 = LookupCreateStruct((Parser *)struct_def,(string *)(piVar31 + 8),
                                                       true,false);
                          *(StructDef **)
                           &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                               *)&local_138[4].type)->_M_t)._M_impl = pSVar13;
                          goto LAB_0010ce18;
                        }
                        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1b0,
                                   "nested_flatbuffer attribute may only apply to a vector of ubyte"
                                   ,"");
                        Error(this,(string *)struct_def);
                      }
                      else {
                        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1b0,
                                   "nested_flatbuffer attribute must be a string (the root type)",""
                                  );
                        Error(this,(string *)struct_def);
                      }
                    }
                  }
                  else {
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b0,
                               "native_custom_alloc can only be used with a table or struct definition"
                               ,"");
                    Error(this,(string *)struct_def);
                  }
                }
LAB_0010cfe9:
                local_68.field_2._M_allocated_capacity = local_1b0.field_2._M_allocated_capacity;
                local_68._M_dataplus._M_p = local_1b0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_0010b945;
              }
            }
          }
          else {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"only non-scalar fields in tables may be \'required\'",
                       "");
            Error(this,(string *)struct_def);
LAB_0010c392:
            local_68.field_2._M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_0010b945;
          }
        }
LAB_0010b93d:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0010b945:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
LAB_0010b952:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;

  if (LookupCreateStruct(name, false, false))
    return Error("field name can not be the same as table/struct name");

  if (!IsLowerSnakeCase(name)) {
    Warning("field names should be lowercase snake_case, got: " + name);
  }

  std::vector<std::string> dc = doc_comment_;
  EXPECT(kTokenIdentifier);
  EXPECT(':');
  Type type;
  ECHECK(ParseType(type));

  if (struct_def.fixed) {
    if (IsIncompleteStruct(type) ||
        (IsArray(type) && IsIncompleteStruct(type.VectorType()))) {
      std::string type_name = IsArray(type) ? type.VectorType().struct_def->name
                                            : type.struct_def->name;
      return Error(
          std::string("Incomplete type in struct is not allowed, type name: ") +
          type_name);
    }

    auto valid = IsScalar(type.base_type) || IsStruct(type);
    if (!valid && IsArray(type)) {
      const auto &elem_type = type.VectorType();
      valid |= IsScalar(elem_type.base_type) || IsStruct(elem_type);
    }
    if (!valid)
      return Error("structs may contain only scalar or struct fields");
  }

  if (!struct_def.fixed && IsArray(type))
    return Error("fixed-length array in table must be wrapped in struct");

  if (IsArray(type)) {
    advanced_features_ |= reflection::AdvancedArrayFeatures;
    if (!SupportsAdvancedArrayFeatures()) {
      return Error(
          "Arrays are not yet supported in all "
          "the specified programming languages.");
    }
  }

  FieldDef *typefield = nullptr;
  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with a special suffix.

    // To ensure compatibility with many codes that rely on the BASE_TYPE_UTYPE value to identify union type fields.
    Type union_type(type.enum_def->underlying_type);
    union_type.base_type = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(),union_type, &typefield));
    
  } else if (IsVector(type) && type.element == BASE_TYPE_UNION) {
    advanced_features_ |= reflection::AdvancedUnionFeatures;
    // Only cpp, js and ts supports the union vector feature so far.
    if (!SupportsAdvancedUnionFeatures()) {
      return Error(
          "Vectors of unions are not yet supported in at least one of "
          "the specified programming languages.");
    }
    // For vector of union fields, add a second auto-generated vector field to
    // hold the types, with a special suffix.
    Type union_vector(BASE_TYPE_VECTOR, nullptr, type.enum_def);
    union_vector.element = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(), union_vector,
                    &typefield));
  }

  FieldDef *field;
  ECHECK(AddField(struct_def, name, type, &field));

  if (typefield) {
    // We preserve the relation between the typefield
    // and field, so we can easily map it in the code
    // generators.
    typefield->sibling_union_field = field;
    field->sibling_union_field = typefield;
  }

  if (token_ == '=') {
    NEXT();
    ECHECK(ParseSingleValue(&field->name, field->value, true));
    if (IsStruct(type) || (struct_def.fixed && field->value.constant != "0"))
      return Error(
          "default values are not supported for struct fields, table fields, "
          "or in structs.");
    if (IsString(type) || IsVector(type)) {
      advanced_features_ |= reflection::DefaultVectorsAndStrings;
      if (field->value.constant != "0" && !SupportsDefaultVectorsAndStrings()) {
        return Error(
            "Default values for strings and vectors are not supported in one "
            "of the specified programming languages");
      }
    }

    if (IsVector(type) && field->value.constant != "0" &&
        field->value.constant != "[]") {
      return Error("The only supported default for vectors is `[]`.");
    }
  }

  // Append .0 if the value has not it (skip hex and scientific floats).
  // This suffix needed for generated C++ code.
  if (IsFloat(type.base_type)) {
    auto &text = field->value.constant;
    FLATBUFFERS_ASSERT(false == text.empty());
    auto s = text.c_str();
    while (*s == ' ') s++;
    if (*s == '-' || *s == '+') s++;
    // 1) A float constants (nan, inf, pi, etc) is a kind of identifier.
    // 2) A float number needn't ".0" at the end if it has exponent.
    if ((false == IsIdentifierStart(*s)) &&
        (std::string::npos == field->value.constant.find_first_of(".eEpP"))) {
      field->value.constant += ".0";
    }
  }

  field->doc_comment = dc;
  ECHECK(ParseMetaData(&field->attributes));
  field->deprecated = field->attributes.Lookup("deprecated") != nullptr;
  auto hash_name = field->attributes.Lookup("hash");
  if (hash_name) {
    switch ((IsVector(type)) ? type.element : type.base_type) {
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: {
        if (FindHashFunction16(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 16 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: {
        if (FindHashFunction32(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 32 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        if (FindHashFunction64(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 64 bit types: " +
                       hash_name->constant);
        break;
      }
      default:
        return Error(
            "only short, ushort, int, uint, long and ulong data types support "
            "hashing.");
    }
  }

  if (field->attributes.Lookup("vector64") != nullptr) {
    if (!IsVector(type)) {
      return Error("`vector64` attribute can only be applied on vectors.");
    }

    // Upgrade the type to be a BASE_TYPE_VECTOR64, since the attributes are
    // parsed after the type.
    const BaseType element_base_type = type.element;
    type = Type(BASE_TYPE_VECTOR64, type.struct_def, type.enum_def);
    type.element = element_base_type;

    // Since the field was already added to the parent object, update the type
    // in place.
    field->value.type = type;

    // 64-bit vectors imply the offset64 attribute.
    field->offset64 = true;
  }

  // Record that this field uses 64-bit offsets.
  if (field->attributes.Lookup("offset64") != nullptr) {
    // TODO(derekbailey): would be nice to have this be a recommendation or hint
    // instead of a warning.
    if (type.base_type == BASE_TYPE_VECTOR64) {
      Warning("attribute `vector64` implies `offset64` and isn't required.");
    }

    field->offset64 = true;
  }

  // Check for common conditions with Offset64 fields.
  if (field->offset64) {
    // TODO(derekbailey): this is where we can disable string support for
    // offset64, as that is not a hard requirement to have.
    if (!IsString(type) && !IsVector(type)) {
      return Error(
          "only string and vectors can have `offset64` attribute applied");
    }

    // If this is a Vector, only scalar and scalar-like (structs) items are
    // allowed.
    // TODO(derekbailey): allow vector of strings, just require that the strings
    // are Offset64<string>.
    if (IsVector(type) &&
        !((IsScalar(type.element) && !IsEnum(type.VectorType())) ||
          IsStruct(type.VectorType()))) {
      return Error("only vectors of scalars are allowed to be 64-bit.");
    }

    // Lastly, check if it is supported by the specified generated languages. Do
    // this last so the above checks can inform the user of schema errors to fix
    // first.
    if (!Supports64BitOffsets()) {
      return Error(
          "fields using 64-bit offsets are not yet supported in at least one "
          "of the specified programming languages.");
    }
  }

  // For historical convenience reasons, string keys are assumed required.
  // Scalars are kDefault unless otherwise specified.
  // Nonscalars are kOptional unless required;
  field->key = field->attributes.Lookup("key") != nullptr;
  const bool required = field->attributes.Lookup("required") != nullptr ||
                        (IsString(type) && field->key);
  const bool default_str_or_vec =
      ((IsString(type) || IsVector(type)) && field->value.constant != "0");
  const bool optional = IsScalar(type.base_type)
                            ? (field->value.constant == "null")
                            : !(required || default_str_or_vec);
  if (required && optional) {
    return Error("Fields cannot be both optional and required.");
  }
  field->presence = FieldDef::MakeFieldPresence(optional, required);

  if (required && (struct_def.fixed || IsScalar(type.base_type))) {
    return Error("only non-scalar fields in tables may be 'required'");
  }
  if (field->key) {
    if (struct_def.has_key) return Error("only one field may be set as 'key'");
    struct_def.has_key = true;
    auto is_valid =
        IsScalar(type.base_type) || IsString(type) || IsStruct(type);
    if (IsArray(type)) {
      is_valid |=
          IsScalar(type.VectorType().base_type) || IsStruct(type.VectorType());
    }
    if (!is_valid) {
      return Error(
          "'key' field must be string, scalar type or fixed size array of "
          "scalars");
    }
  }

  if (field->IsScalarOptional()) {
    advanced_features_ |= reflection::OptionalScalars;
    if (type.enum_def && type.enum_def->Lookup("null")) {
      FLATBUFFERS_ASSERT(IsInteger(type.base_type));
      return Error(
          "the default 'null' is reserved for declaring optional scalar "
          "fields, it conflicts with declaration of enum '" +
          type.enum_def->name + "'.");
    }
    if (field->attributes.Lookup("key")) {
      return Error(
          "only a non-optional scalar field can be used as a 'key' field");
    }
    if (!SupportsOptionalScalars()) {
      return Error(
          "Optional scalars are not yet supported in at least one of "
          "the specified programming languages.");
    }
  }

  if (type.enum_def) {
    // Verify the enum's type and default value.
    const std::string &constant = field->value.constant;
    if (type.base_type == BASE_TYPE_UNION) {
      if (constant != "0") { return Error("Union defaults must be NONE"); }
    } else if (IsVector(type)) {
      if (constant != "0" && constant != "[]") {
        return Error("Vector defaults may only be `[]`.");
      }
    } else if (IsArray(type)) {
      if (constant != "0") {
        return Error("Array defaults are not supported yet.");
      }
    } else {
      if (!IsInteger(type.base_type)) {
        return Error("Enums must have integer base types");
      }
      // Optional and bitflags enums may have default constants that are not
      // their specified variants.
      if (!field->IsOptional() &&
          type.enum_def->attributes.Lookup("bit_flags") == nullptr) {
        if (type.enum_def->FindByValue(constant) == nullptr) {
          return Error("default value of `" + constant + "` for " + "field `" +
                       name + "` is not part of enum `" + type.enum_def->name +
                       "`.");
        }
      }
    }
  }

  if (field->deprecated && struct_def.fixed)
    return Error("can't deprecate fields in a struct");

  auto cpp_type = field->attributes.Lookup("cpp_type");
  if (cpp_type) {
    if (!hash_name)
      return Error("cpp_type can only be used with a hashed field");
    /// forcing cpp_ptr_type to 'naked' if unset
    auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
    if (!cpp_ptr_type) {
      auto val = new Value();
      val->type = cpp_type->type;
      val->constant = "naked";
      field->attributes.Add("cpp_ptr_type", val);
    }
  }

  field->shared = field->attributes.Lookup("shared") != nullptr;
  if (field->shared && field->value.type.base_type != BASE_TYPE_STRING)
    return Error("shared can only be defined on strings");

  auto field_native_custom_alloc =
      field->attributes.Lookup("native_custom_alloc");
  if (field_native_custom_alloc)
    return Error(
        "native_custom_alloc can only be used with a table or struct "
        "definition");

  field->native_inline = field->attributes.Lookup("native_inline") != nullptr;
  if (field->native_inline && !IsStruct(field->value.type) &&
      !IsVectorOfStruct(field->value.type) &&
      !IsVectorOfTable(field->value.type))
    return Error(
        "'native_inline' can only be defined on structs, vector of structs or "
        "vector of tables");

  auto nested = field->attributes.Lookup("nested_flatbuffer");
  if (nested) {
    if (nested->type.base_type != BASE_TYPE_STRING)
      return Error(
          "nested_flatbuffer attribute must be a string (the root type)");
    if (!IsVector(type.base_type) || type.element != BASE_TYPE_UCHAR)
      return Error(
          "nested_flatbuffer attribute may only apply to a vector of ubyte");
    // This will cause an error if the root type of the nested flatbuffer
    // wasn't defined elsewhere.
    field->nested_flatbuffer = LookupCreateStruct(nested->constant);
  }

  if (field->attributes.Lookup("flexbuffer")) {
    field->flexbuffer = true;
    uses_flexbuffers_ = true;
    if (type.base_type != BASE_TYPE_VECTOR || type.element != BASE_TYPE_UCHAR)
      return Error("flexbuffer attribute may only apply to a vector of ubyte");
  }

  if (typefield) {
    if (!IsScalar(typefield->value.type.base_type)) {
      // this is a union vector field
      typefield->presence = field->presence;
    }
    // If this field is a union, and it has a manually assigned id,
    // the automatically added type field should have an id as well (of N - 1).
    auto attr = field->attributes.Lookup("id");
    if (attr) {
      const auto &id_str = attr->constant;
      voffset_t id = 0;
      const auto done = !atot(id_str.c_str(), *this, &id).Check();
      if (done && id > 0) {
        auto val = new Value();
        val->type = attr->type;
        val->constant = NumToString(id - 1);
        typefield->attributes.Add("id", val);
      } else {
        return Error(
            "a union type effectively adds two fields with non-negative ids, "
            "its id must be that of the second field (the first field is "
            "the type field and not explicitly declared in the schema);\n"
            "field: " +
            field->name + ", id: " + id_str);
      }
    }
    // if this field is a union that is deprecated,
    // the automatically added type field should be deprecated as well
    if (field->deprecated) { typefield->deprecated = true; }
  }

  EXPECT(';');
  return NoError();
}